

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_pixel_late(Impl *this)

{
  Builder *this_00;
  Function *entryPoint;
  ExecutionMode mode;
  Capability local_20 [2];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  if ((this->execution_mode_meta).declares_rov == true) {
    spv::Builder::addExtension(this_00,"SPV_EXT_fragment_shader_interlock");
    if ((this->execution_mode_meta).per_sample_shading == true) {
      local_20[0] = CapabilityFragmentShaderSampleInterlockEXT;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this_00->capabilities,local_20);
      mode = ExecutionModeSampleInterlockOrderedEXT;
    }
    else {
      local_20[1] = 0x1502;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this_00->capabilities,local_20 + 1);
      mode = ExecutionModePixelInterlockOrderedEXT;
    }
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,entryPoint,mode,-1,-1,-1);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_pixel_late()
{
	auto &builder = spirv_module.get_builder();

	if (execution_mode_meta.declares_rov)
	{
		builder.addExtension("SPV_EXT_fragment_shader_interlock");
		if (execution_mode_meta.per_sample_shading)
		{
			builder.addCapability(spv::CapabilityFragmentShaderSampleInterlockEXT);
			builder.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSampleInterlockOrderedEXT);
		}
		else
		{
			builder.addCapability(spv::CapabilityFragmentShaderPixelInterlockEXT);
			builder.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModePixelInterlockOrderedEXT);
		}
	}

	return true;
}